

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O1

void __thiscall jsonip::writer<true>::pre(writer<true> *this)

{
  ostream *poVar1;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  if (this->comma == true) {
    poVar1 = this->os;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
    local_40 = (long *)CONCAT71(local_40._1_7_,10);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_40,1);
    local_40 = local_30;
    std::__cxx11::string::_M_construct((ulong)&local_40,(char)this->level * '\x02');
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_40,local_38);
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  return;
}

Assistant:

void pre()
        {
            if (indent_)
            {
                if (comma)
                    os << "," << '\n' << indent();
            }
            else
            {
                if (comma)
                    os << ", ";
            }
        }